

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxToken.cpp
# Opt level: O1

bool __thiscall psy::C::SyntaxToken::isComment(SyntaxToken *this)

{
  if ((3 < this->syntaxK_ - 2) && (this->syntaxK_ != Keyword_ExtPSY_omission)) {
    return false;
  }
  return true;
}

Assistant:

bool SyntaxToken::isComment() const
{
    return syntaxK_ == SyntaxKind::MultiLineCommentTrivia
            || syntaxK_ == SyntaxKind::MultiLineDocumentationCommentTrivia
            || syntaxK_ == SyntaxKind::SingleLineCommentTrivia
            || syntaxK_ == SyntaxKind::SingleLineDocumentationCommentTrivia
            || syntaxK_ == SyntaxKind::Keyword_ExtPSY_omission;
}